

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.h
# Opt level: O2

void __thiscall bidirectional::Search::replaceIntermediateLabel(Search *this,Label *label)

{
  element_type *peVar1;
  Vertex VVar2;
  element_type *local_18;
  Vertex VStack_10;
  
  std::make_shared<labelling::Label,labelling::Label_const&>((Label *)&stack0xffffffffffffffe8);
  peVar1 = (this->intermediate_label).
           super___shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  VVar2 = (Vertex)(this->intermediate_label).
                  super___shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  (this->intermediate_label).super___shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = local_18;
  (this->intermediate_label).super___shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)VStack_10;
  local_18 = peVar1;
  VStack_10 = VVar2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xfffffffffffffff0);
  return;
}

Assistant:

void replaceIntermediateLabel(const labelling::Label& label) {
    auto label_ptr = std::make_shared<labelling::Label>(label);
    intermediate_label.swap(label_ptr);
  }